

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::UnaryExpr<const_args::ValueFlag<char,_args::ValueReader>_&>::streamReconstructedExpression
          (UnaryExpr<const_args::ValueFlag<char,_args::ValueReader>_&> *this,ostream *os)

{
  ValueFlag<char,_args::ValueReader> *in_RDX;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  UnaryExpr<const_args::ValueFlag<char,_args::ValueReader>_&> *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  Detail::stringify<args::ValueFlag<char,args::ValueReader>>(&local_38,(Detail *)this->m_lhs,in_RDX)
  ;
  std::operator<<(os,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }